

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int nbQubits;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  int i;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  allocator_type local_129;
  double t_cpu;
  int local_120;
  int local_11c;
  double t_gpu;
  int local_10c;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> psi;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> circuit;
  vector<int,_std::allocator<int>_> qubits;
  value_type local_a0;
  vector<double,_std::allocator<double>_> T_gpu;
  vector<double,_std::allocator<double>_> T_cpu;
  value_type local_58;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_48;
  
  bVar9 = true;
  iVar2 = 0x14;
  nbQubits = 10;
  local_11c = 2;
  if (argc < 2) {
    cVar8 = 'd';
  }
  else {
    cVar8 = *argv[1];
    if (argc != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&circuit,argv[2],(allocator<char> *)&psi);
      nbQubits = std::__cxx11::stoi((string *)&circuit,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&circuit);
      if (3 < (uint)argc) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&circuit,argv[3],(allocator<char> *)&psi);
        iVar2 = std::__cxx11::stoi((string *)&circuit,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&circuit);
        if (argc != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&circuit,argv[4],(allocator<char> *)&psi);
          local_11c = std::__cxx11::stoi((string *)&circuit,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&circuit);
          if (5 < (uint)argc) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&circuit,argv[5],(allocator<char> *)&psi);
            uVar3 = std::__cxx11::stoi((string *)&circuit,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&circuit);
            bVar9 = (uVar3 & 0xfffffffd) == 1;
          }
        }
      }
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"nb qubits = ");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,nbQubits);
  poVar6 = std::operator<<(poVar6,":");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_11c);
  poVar6 = std::operator<<(poVar6,":");
  std::ostream::operator<<((ostream *)poVar6,iVar2);
  local_10c = iVar2;
  if (cVar8 == 'd') {
    poVar6 = std::operator<<((ostream *)&std::cout,", T = std::complex<double>");
    std::endl<char,std::char_traits<char>>(poVar6);
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    while (local_120 = nbQubits, nbQubits <= iVar2) {
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::QCircuit
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)&circuit,
                 nbQubits);
      trotter<std::complex<double>>
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)&circuit)
      ;
      t_cpu = 9999.0;
      t_gpu = 9999.0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar9) {
        poVar6 = std::operator<<((ostream *)&std::cout,"CPU(");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,nbQubits);
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        uVar3 = 3;
        uVar5 = 0;
LAB_00105a5f:
        uVar4 = uVar5 + 1;
        if ((int)uVar5 < (int)uVar3) {
          local_58._M_value._0_8_ = 0;
          local_58._M_value._8_8_ = 0;
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     &local_48,1L << ((byte)nbQubits & 0x3f),&local_58,(allocator_type *)&local_129)
          ;
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::_M_move_assign
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&psi,
                     &local_48);
          std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::
          ~_Vector_base(&local_48);
          (psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_value = 0x3ff0000000000000;
          psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
          .super__Vector_impl_data._M_start[1]._M_value = 0;
          local_a0._M_value = std::chrono::_V2::system_clock::now();
          qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::simulate
                    ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
                     &circuit,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               *)&psi);
          dVar1 = toc((TP *)&local_a0);
          if (dVar1 < t_cpu) {
            t_cpu = dVar1;
          }
          if (uVar4 != 3) goto code_r0x00105b00;
          uVar5 = 100;
          if ((0.1 <= t_cpu) && (uVar5 = uVar3, t_cpu < 1.0)) {
            uVar5 = 10;
          }
          bVar10 = uVar5 == 3;
          uVar3 = uVar5;
          goto LAB_00105b49;
        }
        printf("  -->  min t_cpu = %.6fs\n",SUB84(t_cpu,0));
        iVar2 = local_10c;
        if ((t_cpu == 9999.0) && (!NAN(t_cpu))) goto LAB_00105ba7;
      }
      else {
LAB_00105ba7:
        t_cpu = 0.0;
      }
      if ((t_gpu == 9999.0) && (!NAN(t_gpu))) {
        t_gpu = 0.0;
      }
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&psi)
      ;
      qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::~QCircuit
                ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)&circuit)
      ;
      std::vector<int,_std::allocator<int>_>::push_back(&qubits,&local_120);
      std::vector<double,_std::allocator<double>_>::push_back(&T_cpu,&t_cpu);
      std::vector<double,_std::allocator<double>_>::push_back(&T_gpu,&t_gpu);
      nbQubits = local_120 + local_11c;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",
             SUB84(T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],0),
             T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7],
             T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] /
             T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7],
             (ulong)(uint)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    if (cVar8 != 's') {
      return -100;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,", T = std::complex<float>");
    std::endl<char,std::char_traits<char>>(poVar6);
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    while (local_120 = nbQubits, nbQubits <= iVar2) {
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
                (&circuit,nbQubits);
      trotter<std::complex<float>>(&circuit);
      t_cpu = 9999.0;
      t_gpu = 9999.0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar9) {
        poVar6 = std::operator<<((ostream *)&std::cout,"CPU(");
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,nbQubits);
        poVar6 = std::operator<<(poVar6,")");
        std::endl<char,std::char_traits<char>>(poVar6);
        uVar3 = 3;
        uVar5 = 0;
LAB_001057ad:
        uVar4 = uVar5 + 1;
        if ((int)uVar5 < (int)uVar3) {
          local_a0._M_value = 0;
          std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
                    ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&local_48
                     ,1L << ((byte)nbQubits & 0x3f),&local_a0,&local_129);
          std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::_M_move_assign
                    (&psi,&local_48);
          std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::
          ~_Vector_base((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                        &local_48);
          (psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_value = 0x3f800000;
          local_58._M_value._0_8_ = std::chrono::_V2::system_clock::now();
          qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::simulate
                    (&circuit,&psi);
          dVar1 = toc((TP *)&local_58);
          if (dVar1 < t_cpu) {
            t_cpu = dVar1;
          }
          if (uVar4 != 3) goto code_r0x0010584a;
          uVar5 = 100;
          if ((0.1 <= t_cpu) && (uVar5 = uVar3, t_cpu < 1.0)) {
            uVar5 = 10;
          }
          bVar10 = uVar5 == 3;
          uVar3 = uVar5;
          goto LAB_00105893;
        }
        printf("  -->  min t_cpu = %.6fs\n",SUB84(t_cpu,0));
        iVar2 = local_10c;
        if ((t_cpu == 9999.0) && (!NAN(t_cpu))) goto LAB_001058f8;
      }
      else {
LAB_001058f8:
        t_cpu = 0.0;
      }
      if ((t_gpu == 9999.0) && (!NAN(t_gpu))) {
        t_gpu = 0.0;
      }
      std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
                (&psi.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                );
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::~QCircuit
                (&circuit);
      std::vector<int,_std::allocator<int>_>::push_back(&qubits,&local_120);
      std::vector<double,_std::allocator<double>_>::push_back(&T_cpu,&t_cpu);
      std::vector<double,_std::allocator<double>_>::push_back(&T_gpu,&t_gpu);
      nbQubits = local_120 + local_11c;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar7 = uVar7 + 1) {
      printf("  %2i | %12.6fs | %12.6fs | %6.2fx\n",
             SUB84(T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],0),
             T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7],
             T_cpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] /
             T_gpu.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7],
             (ulong)(uint)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&T_gpu.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&T_cpu.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
code_r0x00105b00:
  bVar10 = uVar3 == uVar4;
  if ((uVar5 < 3) || (uVar5 = uVar4, uVar3 == uVar4)) {
LAB_00105b49:
    printf("  * it%4i:%12.6fs",(ulong)uVar4);
    uVar5 = uVar4;
    if (!bVar10) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  goto LAB_00105a5f;
code_r0x0010584a:
  bVar10 = uVar3 == uVar4;
  if ((uVar5 < 3) || (uVar5 = uVar4, uVar3 == uVar4)) {
LAB_00105893:
    printf("  * it%4i:%12.6fs",(ulong)uVar4);
    uVar5 = uVar4;
    if (!bVar10) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  goto LAB_001057ad;
}

Assistant:

int main( int argc , char *argv[] ) {

  // defaults
  char type = 'd' ;
  int  qmin = 10 ;
  int  qmax = 20 ;
  int  qstp = 2 ;
  int  test = 3 ;

  // arguments
  if ( argc > 1 ) type = argv[1][0] ;
  if ( argc > 2 ) qmin = std::stoi( argv[2] ) ;
  if ( argc > 3 ) qmax = std::stoi( argv[3] ) ;
  if ( argc > 4 ) qstp = std::stoi( argv[4] ) ;
  if ( argc > 5 ) test = std::stoi( argv[5] ) ;
  std::cout << "nb qubits = " << qmin << ":" << qstp << ":" << qmax ;

  int r = 0 ;
  if ( type == 's' ) {
    // float
    std::cout << ", T = std::complex<float>" << std::endl ;
    using T = std::complex< float > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else if ( type == 'd' ) {
    // double
    using T = std::complex< double > ;
    auto f = [&] ( qclab::QCircuit< T >& circuit ) { trotter( circuit ) ; } ;
    std::cout << ", T = std::complex<double>" << std::endl ;
    r = timings< T >( qmin , qmax , qstp , test , f ) ;
  } else {
    r = -100 ;
  }
  return r ;

}